

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_block.cpp
# Opt level: O3

void multikey_block<1024u,unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  size_t *psVar1;
  uchar *puVar2;
  ulong uVar3;
  _List_node_base *__dest;
  pointer ppppuVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_short uVar7;
  ushort uVar8;
  uint j;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  long lVar11;
  long lVar12;
  _List_node_base *p_Var13;
  undefined2 uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uchar **ppuVar19;
  _List_node_base *__dest_00;
  ulong uVar20;
  ulong uVar21;
  array<unsigned_long,_3UL> bucketsize;
  array<unsigned_short,_32UL> cache;
  char local_102;
  vector<unsigned_char_***,_std::allocator<unsigned_char_***>_> local_c8;
  ulong local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  long local_78;
  allocator_type local_70 [64];
  
  if (n < 10000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      buckets_abi_cxx11_ == '\0') {
    multikey_block<1024u,unsigned_short>();
  }
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_ == '\0') {
    multikey_block<1024u,unsigned_short>();
  }
  uVar7 = pseudo_median<unsigned_short>(strings,n,depth);
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            (&local_c8,(n >> 10) + 1,local_70);
  local_a8 = 0;
  sStack_a0 = 0;
  local_98 = 0;
  p_Var9 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[0].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)
                   &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_) {
    p_Var10 = (((list<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)&p_Var9->_M_next)->
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>)._M_impl._M_node
              .super__List_node_base._M_next;
    operator_delete(p_Var9);
    p_Var9 = p_Var10;
  }
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_;
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_;
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[0].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  p_Var9 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[1].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)
                   (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems + 1)) {
    p_Var10 = p_Var9->_M_next;
    operator_delete(p_Var9);
    p_Var9 = p_Var10;
  }
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 1);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 1);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[1].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  p_Var9 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[2].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)
                   (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems + 2)) {
    p_Var10 = p_Var9->_M_next;
    operator_delete(p_Var9);
    p_Var9 = p_Var10;
  }
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 2);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
  super__List_node_base._M_next =
       (_List_node_base *)
       (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        buckets_abi_cxx11_._M_elems + 2);
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  buckets_abi_cxx11_._M_elems[2].
  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size = 0;
  if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)
      &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
       freeblocks_abi_cxx11_) {
    __assert_fail("freeblocks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                  ,0x54,
                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                 );
  }
  lVar17 = 0;
  multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
  freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        freeblocks_abi_cxx11_;
  do {
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next =
         (_List_node_base *)
         ((long)multikey_block<1024U,_unsigned_short>::temp_space._M_elems + lVar17);
    std::__detail::_List_node_base::_M_hook(p_Var9);
    multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
    freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl._M_node._M_size =
         multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
         freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
         ._M_impl._M_node._M_size + 1;
    lVar17 = lVar17 + 0x2000;
  } while (lVar17 != 0x40000);
  if ((n & 0xfffffffffffffc00) != 0) {
    uVar20 = 0;
    p_Var9 = (_List_node_base *)strings;
    do {
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = p_Var9;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node._M_size =
           multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           freeblocks_abi_cxx11_.
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           _M_size + 1;
      uVar20 = uVar20 + 0x400;
      p_Var9 = p_Var9 + 0x200;
    } while (uVar20 < (n & 0xfffffffffffffc00));
  }
  if ((n & 0xffffffffffffffe0) == 0) {
    uVar20 = 0;
  }
  else {
    uVar20 = 0;
    ppuVar19 = strings;
    do {
      lVar17 = 0;
      do {
        puVar2 = ppuVar19[lVar17];
        if (puVar2 == (uchar *)0x0) goto LAB_00221984;
        if (puVar2[depth] == '\0') {
          uVar14 = 0;
        }
        else {
          uVar14 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        *(undefined2 *)(local_70 + lVar17 * 2) = uVar14;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x20);
      lVar17 = 0;
      do {
        p_Var9 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                 freeblocks_abi_cxx11_.
                 super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 _M_node.super__List_node_base._M_next;
        uVar8 = *(ushort *)(local_70 + lVar17 * 2);
        lVar16 = (ulong)(uVar8 == uVar7) + (ulong)(uVar7 <= uVar8 && uVar8 != uVar7) * 2;
        uVar3 = (&local_a8)[lVar16];
        uVar21 = uVar3 & 0x3ff;
        if (uVar21 == 0) {
          if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next ==
              (_List_node_base *)
              &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               freeblocks_abi_cxx11_) goto LAB_00221965;
          p_Var10 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node.super__List_node_base._M_next[1]._M_next;
          multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var9);
          p_Var9 = (_List_node_base *)operator_new(0x18);
          p_Var9[1]._M_next = p_Var10;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          psVar1 = &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::buckets_abi_cxx11_._M_elems[lVar16].
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (p_Var10 < (_List_node_base *)(strings + n) && strings <= p_Var10) {
            lVar11 = (long)p_Var10 - (long)strings >> 3;
            lVar12 = lVar11 + 0x3ff;
            if (-1 < lVar11) {
              lVar12 = lVar11;
            }
            local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar12 >> 10] =
                 (uchar ***)
                 (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::buckets_abi_cxx11_._M_elems[lVar16].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1);
          }
        }
        if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
             &((_List_node_base *)
              (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               buckets_abi_cxx11_._M_elems + lVar16))->_M_next)->_M_impl)._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar16)) {
          __assert_fail("not buckets[b].empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x6e,
                        "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                       );
        }
        (&(multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems[lVar16].
           super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
           super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar21] =
             (_List_node_base *)ppuVar19[lVar17];
        (&local_a8)[lVar16] = uVar3 + 1;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x20);
      uVar20 = uVar20 + 0x20;
      ppuVar19 = ppuVar19 + 0x20;
    } while (uVar20 < (n & 0xffffffffffffffe0));
  }
  if (uVar20 < n) {
    do {
      p_Var9 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
               freeblocks_abi_cxx11_.
               super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node
               .super__List_node_base._M_next;
      puVar2 = strings[uVar20];
      if (puVar2 == (uchar *)0x0) {
LAB_00221984:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      lVar17 = (ulong)(uVar8 == uVar7) + (ulong)(uVar7 < uVar8) * 2;
      uVar3 = (&local_a8)[lVar17];
      uVar21 = uVar3 & 0x3ff;
      if (uVar21 == 0) {
        if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_.
            super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
            super__List_node_base._M_next ==
            (_List_node_base *)
            &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_) {
LAB_00221965:
          __assert_fail("not fb.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                        ,0x3a,"Block take_free_block(FreeBlocks &)");
        }
        p_Var10 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next[1]._M_next;
        multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
        freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
        _M_impl._M_node._M_size =
             multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             freeblocks_abi_cxx11_.
             super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
             _M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var9);
        p_Var9 = (_List_node_base *)operator_new(0x18);
        p_Var9[1]._M_next = p_Var10;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        psVar1 = &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::buckets_abi_cxx11_._M_elems[lVar17].
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (p_Var10 < (_List_node_base *)(strings + n) && strings <= p_Var10) {
          lVar12 = (long)p_Var10 - (long)strings >> 3;
          lVar16 = lVar12 + 0x3ff;
          if (-1 < lVar12) {
            lVar16 = lVar12;
          }
          local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
          .super__Vector_impl_data._M_start[lVar16 >> 10] =
               (uchar ***)
               (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                buckets_abi_cxx11_._M_elems[lVar17].
                super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                _M_node.super__List_node_base._M_prev + 1);
        }
      }
      if ((((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
           &((_List_node_base *)
            (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
             buckets_abi_cxx11_._M_elems + lVar17))->_M_next)->_M_impl)._M_node.
          super__List_node_base._M_next ==
          (_List_node_base *)
          (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
           buckets_abi_cxx11_._M_elems + lVar17)) {
        __assert_fail("not buckets[b].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                      ,0x80,
                      "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                     );
      }
      (&(multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
         buckets_abi_cxx11_._M_elems[lVar17].
         super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
         super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar21] =
           (_List_node_base *)strings[uVar20];
      (&local_a8)[lVar17] = uVar3 + 1;
      uVar20 = uVar20 + 1;
    } while (n != uVar20);
  }
  local_80 = local_a8;
  local_88 = sStack_a0;
  local_90 = local_98;
  if (local_a8 + sStack_a0 + local_98 != n) {
    __assert_fail("bucketsize[0]+bucketsize[1]+bucketsize[2]==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                  ,0x84,
                  "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                 );
  }
  p_Var9 = (_List_node_base *)(strings + n);
  lVar17 = 0;
  uVar20 = 0;
  do {
    uVar3 = (&local_a8)[lVar17];
    local_78 = lVar17;
    if (uVar3 != 0) {
      p_Var10 = (_List_node_base *)
                (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
                 buckets_abi_cxx11_._M_elems + lVar17);
      uVar21 = 0;
      do {
        uVar18 = uVar3 - uVar21;
        if (0x3ff < uVar18) {
          uVar18 = 0x400;
        }
        p_Var10 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                   &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        p_Var13 = p_Var10[1]._M_next;
        __dest_00 = (_List_node_base *)(strings + uVar20);
        if (p_Var13 == __dest_00) {
          if ((uVar20 & 0x3ff) != 0) {
            __assert_fail("pos%B==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                          ,0x92,
                          "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                         );
          }
          *(undefined8 *)
           ((long)local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                  ._M_impl.super__Vector_impl_data._M_start + (uVar20 >> 7)) = 0;
        }
        else {
          uVar15 = (uVar18 + uVar20) - 1 >> 10;
          if (local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar15] != (uchar ***)0x0) {
            do {
              p_Var13 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                        ::freeblocks_abi_cxx11_.
                        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl._M_node.super__List_node_base._M_next;
              if (multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                  ::freeblocks_abi_cxx11_.
                  super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  _M_node.super__List_node_base._M_next ==
                  (_List_node_base *)
                  &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                   ::freeblocks_abi_cxx11_) goto LAB_00221965;
              __dest = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                       ::freeblocks_abi_cxx11_.
                       super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                       ._M_node.super__List_node_base._M_next[1]._M_next;
              multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              _M_size = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                        ::freeblocks_abi_cxx11_.
                        super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl._M_node._M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var13);
              ppppuVar4 = local_c8.
                          super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            } while ((strings <= __dest) && (__dest < __dest_00));
            if (__dest < p_Var9 && strings <= __dest) {
              lVar16 = (long)__dest - (long)strings >> 3;
              lVar17 = lVar16 + 0x3ff;
              if (-1 < lVar16) {
                lVar17 = lVar16;
              }
              if (local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar17 >> 10] != (uchar ***)0x0) {
                __assert_fail("backlinks[(tmp-strings)/B]==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                              ,0xa2,
                              "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                             );
              }
              local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar17 >> 10] =
                   local_c8.
                   super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar15];
            }
            memcpy(__dest,*local_c8.
                           super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15],0x2000);
            *ppppuVar4[uVar15] = (uchar **)__dest;
            local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar15] = (uchar ***)0x0;
            p_Var13 = p_Var10[1]._M_next;
          }
          if (p_Var13 < p_Var9 && strings <= p_Var13) {
            if (p_Var13 <= __dest_00) {
              __assert_fail("*it > strings+pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_block.cpp"
                            ,0xaa,
                            "void multikey_block(unsigned char **, size_t, size_t) [B = 1024U, CharT = unsigned short]"
                           );
            }
            lVar16 = (long)p_Var13 - (long)strings >> 3;
            lVar17 = lVar16 + 0x3ff;
            if (-1 < lVar16) {
              lVar17 = lVar16;
            }
            local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar17 >> 10] = (uchar ***)0x0;
            p_Var13 = p_Var10[1]._M_next;
          }
          memcpy(__dest_00,p_Var13,uVar18 * 8);
          if (p_Var10[1]._M_next < p_Var9 && strings <= p_Var10[1]._M_next) {
            p_Var13 = (_List_node_base *)operator_new(0x18);
            p_Var13[1]._M_next = p_Var10[1]._M_next;
          }
          else {
            p_Var13 = (_List_node_base *)operator_new(0x18);
            p_Var13[1]._M_next = p_Var10[1]._M_next;
          }
          std::__detail::_List_node_base::_M_hook(p_Var13);
          multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
          freeblocks_abi_cxx11_.
          super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
          _M_size = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)
                    ::freeblocks_abi_cxx11_.
                    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    _M_node._M_size + 1;
        }
        uVar20 = uVar20 + uVar18;
        uVar21 = uVar21 + 0x400;
      } while (uVar21 < uVar3);
    }
    lVar17 = local_78 + 1;
    p_Var10 = multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_.
              super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
              super__List_node_base._M_next;
    ppppuVar4 = local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (lVar17 == 3) {
      while (p_Var10 !=
             (_List_node_base *)
             &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
              freeblocks_abi_cxx11_) {
        p_Var9 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                  &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
        super__Vector_impl_data._M_start = ppppuVar4;
        operator_delete(p_Var10);
        p_Var10 = p_Var9;
        ppppuVar4 = local_c8.
                    super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      }
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_;
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           &multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
            freeblocks_abi_cxx11_;
      multikey_block<1024u,unsigned_short>(unsigned_char**,unsigned_long,unsigned_long)::
      freeblocks_abi_cxx11_.super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl._M_node._M_size = 0;
      local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppppuVar4 != (pointer)0x0) {
        operator_delete(ppppuVar4);
      }
      sVar6 = local_80;
      multikey_block<1024u,unsigned_short>(strings,local_80,depth);
      sVar5 = local_88;
      local_102 = (char)uVar7;
      if (local_102 != '\0') {
        multikey_block<1024u,unsigned_short>(strings + sVar6,local_88,depth + 2);
      }
      multikey_block<1024u,unsigned_short>(strings + sVar6 + sVar5,local_90,depth);
      if (local_c8.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

static void
multikey_block(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 10000) {
		mkqsort(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, 32*B> temp_space;
	static FreeBlocks freeblocks;
	const CharT partval = pseudo_median<CharT>(strings, n, depth);
	BackLinks backlinks(n/B+1);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	buckets[0].clear();
	buckets[1].clear();
	buckets[2].clear();
	// Initialize our list of free blocks.
	assert(freeblocks.empty());
	for (size_t i=0; i < 32; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-n%B; i+=B)
		freeblocks.push_back(strings+i);
	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const CharT c = cache[j];
			const unsigned b = get_bucket(c, partval);
			if (bucketsize[b] % B == 0) {
				Block block = take_free_block(freeblocks);
				buckets[b].push_back(block);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (block >= strings && block < strings+n) {
					backlinks[(block-strings)/B] =
						&(buckets[b].back());
				}
			}
			assert(not buckets[b].empty());
			buckets[b].back()[bucketsize[b] % B] = strings[i+j];
			++bucketsize[b];
		}
	}
	for (; i < n; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		if (bucketsize[b] % B == 0) {
			Block block = take_free_block(freeblocks);
			buckets[b].push_back(block);
			// Backlinks must be set for those blocks, that
			// use the original string array space.
			if (block >= strings && block < strings+n) {
				backlinks[(block-strings)/B] =
					&(buckets[b].back());
			}
		}
		assert(not buckets[b].empty());
		buckets[b].back()[bucketsize[b] % B] = strings[i];
		++bucketsize[b];
	}
	assert(bucketsize[0]+bucketsize[1]+bucketsize[2]==n);
	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 3; ++i) {
		if (bucketsize[i] == 0) continue;
		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;
			if (*it == (strings+pos)) {
				// Already at correct place.
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}
			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}
			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}
			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));
			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}
			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear(); BackLinks().swap(backlinks);
	multikey_block<B, CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_block<B, CharT>(strings+bucketsize[0], bucketsize[1],
				depth+sizeof(CharT));
	multikey_block<B, CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}